

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O3

int sat_solver3_minimize_assumptions(sat_solver3 *s,int *pLits,int nLits,int nConfLimit)

{
  bool bVar1;
  ABC_INT64_T AVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar10;
  ulong uVar11;
  ulong uVar9;
  
  if (nLits == 1) {
LAB_00903401:
    AVar2 = s->nConfLimit;
    s->nConfLimit = (long)nConfLimit;
    iVar3 = sat_solver3_solve_internal(s);
    s->nConfLimit = (long)(int)AVar2;
    return (uint)(iVar3 != -1);
  }
LAB_00903437:
  if (nLits < 2) {
    __assert_fail("nLits >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x865,"int sat_solver3_minimize_assumptions(sat_solver3 *, int *, int, int)");
  }
  uVar8 = (uint)nLits >> 1;
  uVar9 = (ulong)uVar8;
  iVar3 = 1;
  uVar11 = 0;
  do {
    iVar4 = sat_solver3_push(s,pLits[uVar11]);
    if (iVar4 == 0) goto LAB_009035ec;
    uVar11 = uVar11 + 1;
    iVar3 = iVar3 + 1;
  } while (uVar9 != uVar11);
  uVar5 = sat_solver3_minimize_assumptions(s,pLits + uVar9,nLits - uVar8,nConfLimit);
  uVar7 = uVar8;
  do {
    sat_solver3_pop(s);
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
  if ((s->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->temp_clause).size = 0;
  piVar6 = (s->temp_clause).ptr;
  uVar11 = 0;
  do {
    iVar3 = pLits[uVar11];
    uVar7 = (s->temp_clause).size;
    if (uVar7 == (s->temp_clause).cap) {
      iVar4 = (uVar7 >> 1) * 3;
      if ((int)uVar7 < 4) {
        iVar4 = uVar7 * 2;
      }
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)iVar4 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)iVar4 << 2);
      }
      (s->temp_clause).ptr = piVar6;
      if (piVar6 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->temp_clause).cap * 9.5367431640625e-07,
               (double)iVar4 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->temp_clause).cap = iVar4;
      uVar7 = (s->temp_clause).size;
    }
    (s->temp_clause).size = uVar7 + 1;
    piVar6[(int)uVar7] = iVar3;
    uVar11 = uVar11 + 1;
  } while (uVar9 != uVar11);
  uVar10 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      pLits[uVar11] = (pLits + uVar9)[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  piVar6 = (s->temp_clause).ptr;
  uVar11 = 0;
  do {
    (pLits + (int)uVar5)[uVar11] = piVar6[uVar11];
    uVar11 = uVar11 + 1;
  } while (uVar9 != uVar11);
  if ((int)uVar5 < 1) {
    iVar3 = sat_solver3_minimize_assumptions(s,pLits + (int)uVar5,uVar8,nConfLimit);
LAB_00903647:
    return iVar3 + uVar5;
  }
  iVar3 = 1;
  uVar11 = 0;
  while (iVar4 = sat_solver3_push(s,pLits[uVar11]), iVar4 != 0) {
    uVar11 = uVar11 + 1;
    iVar3 = iVar3 + 1;
    if (uVar10 == uVar11) {
      iVar3 = sat_solver3_minimize_assumptions(s,pLits + uVar10,uVar8,nConfLimit);
      uVar8 = uVar5;
      if (0 < (int)uVar5) {
        do {
          sat_solver3_pop(s);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      goto LAB_00903647;
    }
  }
  do {
    sat_solver3_pop(s);
    iVar4 = iVar3 + -1;
    bVar1 = 0 < iVar3;
    iVar3 = iVar4;
  } while (iVar4 != 0 && bVar1);
  goto LAB_00903606;
LAB_009035ec:
  do {
    sat_solver3_pop(s);
    iVar4 = iVar3 + -1;
    bVar1 = 0 < iVar3;
    iVar3 = iVar4;
  } while (iVar4 != 0 && bVar1);
LAB_00903606:
  nLits = (int)uVar11 + 1;
  if ((int)uVar11 == 0) goto LAB_00903401;
  goto LAB_00903437;
}

Assistant:

int sat_solver3_minimize_assumptions( sat_solver3* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        int status = l_False;
        int Temp = s->nConfLimit; 
        s->nConfLimit = nConfLimit;
        status = sat_solver3_solve_internal( s );
        s->nConfLimit = Temp;
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the right lits
    nResL = sat_solver3_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver3_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the left lits
    nResR = sat_solver3_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver3_pop(s);
    return nResL + nResR;
}